

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void anon_unknown.dwarf_e01d56::processLinkDirectories
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *directories,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *uniqueDirectories,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugDirectories,string *language)

{
  pointer ppTVar1;
  TargetPropertyEntry *pTVar2;
  cmLocalGenerator *this;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  PolicyStatus PVar6;
  pointer ppTVar7;
  undefined4 extraout_var;
  ostream *poVar8;
  cmake *this_00;
  PolicyID id;
  MessageType t;
  pointer in_name;
  __ireturn_type _Var9;
  allocator<char> local_299;
  cmGeneratorTarget *local_298;
  string *local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryDirectories;
  string usedDirectories;
  cmListFileBacktrace local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream e;
  
  ppTVar7 = (entries->
            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppTVar1 = (entries->
            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_298 = tgt;
  do {
    if (ppTVar7 == ppTVar1) {
      return;
    }
    pTVar2 = *ppTVar7;
    local_290 = cmLinkItem::AsStr_abi_cxx11_(&pTVar2->LinkImplItem->super_cmLinkItem);
    entryDirectories.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    entryDirectories.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    entryDirectories.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar5 = (*pTVar2->_vptr_TargetPropertyEntry[3])
                      (pTVar2,local_298->LocalGenerator,config,0,local_298,dagChecker,language);
    cmSystemTools::ExpandListArgument
              ((string *)CONCAT44(extraout_var,iVar5),&entryDirectories,false);
    pbVar3 = entryDirectories.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    usedDirectories._M_dataplus._M_p = (pointer)&usedDirectories.field_2;
    usedDirectories._M_string_length = 0;
    usedDirectories.field_2._M_local_buf[0] = '\0';
    in_name = entryDirectories.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (in_name == pbVar3) break;
      bVar4 = cmsys::SystemTools::FileIsFullPath(in_name);
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        if (local_290->_M_string_length == 0) {
          PVar6 = cmGeneratorTarget::GetPolicyStatusCMP0081(local_298);
          if (PVar6 == OLD) {
            bVar4 = true;
LAB_002f12c3:
            t = FATAL_ERROR;
          }
          else {
            if (PVar6 != WARN) {
              bVar4 = false;
              goto LAB_002f12c3;
            }
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_208,(cmPolicies *)0x51,id);
            poVar8 = std::operator<<((ostream *)&e,(string *)&local_208);
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string((string *)&local_208);
            t = AUTHOR_WARNING;
            bVar4 = false;
          }
          poVar8 = std::operator<<((ostream *)&e,
                                   "Found relative path while evaluating link directories of \"");
          poVar8 = std::operator<<(poVar8,(string *)&local_298->Target->Name);
          poVar8 = std::operator<<(poVar8,"\":\n  \"");
          poVar8 = std::operator<<(poVar8,(string *)in_name);
          std::operator<<(poVar8,"\"\n");
          if (!bVar4) goto LAB_002f131b;
        }
        else {
          poVar8 = std::operator<<((ostream *)&e,"Target \"");
          poVar8 = std::operator<<(poVar8,(string *)local_290);
          poVar8 = std::operator<<(poVar8,
                                   "\" contains relative path in its INTERFACE_LINK_DIRECTORIES:\n  \""
                                  );
          poVar8 = std::operator<<(poVar8,(string *)in_name);
          std::operator<<(poVar8,"\"");
          t = FATAL_ERROR;
LAB_002f131b:
          this = local_298->LocalGenerator;
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(this,t,&local_208);
          std::__cxx11::string::~string((string *)&local_208);
          if (t == FATAL_ERROR) {
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
            std::__cxx11::string::~string((string *)&usedDirectories);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&entryDirectories);
            return;
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
      cmsys::SystemTools::ConvertToUnixSlashes(in_name);
      _Var9 = std::__detail::
              _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)uniqueDirectories,in_name);
      if ((((undefined1  [16])_Var9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
         (std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     directories,in_name), debugDirectories)) {
        std::operator+(&local_208," * ",in_name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                       &local_208,"\n");
        std::__cxx11::string::append((string *)&usedDirectories);
        std::__cxx11::string::~string((string *)&e);
        std::__cxx11::string::~string((string *)&local_208);
      }
      in_name = in_name + 1;
    }
    if (usedDirectories._M_string_length != 0) {
      this_00 = cmLocalGenerator::GetCMakeInstance(local_298->LocalGenerator);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"Used link directories for target ",&local_299);
      std::operator+(&local_1c8,&local_1e8,&local_298->Target->Name);
      std::operator+(&local_208,&local_1c8,":\n");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                     &local_208,&usedDirectories);
      (*pTVar2->_vptr_TargetPropertyEntry[4])(&local_218);
      cmake::IssueMessage(this_00,LOG,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                          &local_218);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_218.TopEntry.
                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    std::__cxx11::string::~string((string *)&usedDirectories);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&entryDirectories);
    ppTVar7 = ppTVar7 + 1;
  } while( true );
}

Assistant:

void processLinkDirectories(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<BT<std::string>>& directories,
  std::unordered_set<std::string>& uniqueDirectories,
  cmGeneratorExpressionDAGChecker* dagChecker, const std::string& config,
  bool debugDirectories, std::string const& language)
{
  for (cmGeneratorTarget::TargetPropertyEntry* entry : entries) {
    cmLinkImplItem const& item = entry->LinkImplItem;
    std::string const& targetName = item.AsStr();

    std::vector<std::string> entryDirectories;
    cmSystemTools::ExpandListArgument(entry->Evaluate(tgt->GetLocalGenerator(),
                                                      config, false, tgt,
                                                      dagChecker, language),
                                      entryDirectories);

    std::string usedDirectories;
    for (std::string& entryDirectory : entryDirectories) {
      if (!cmSystemTools::FileIsFullPath(entryDirectory)) {
        std::ostringstream e;
        bool noMessage = false;
        MessageType messageType = MessageType::FATAL_ERROR;
        if (!targetName.empty()) {
          /* clang-format off */
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_LINK_DIRECTORIES:\n"
            "  \"" << entryDirectory << "\"";
          /* clang-format on */
        } else {
          switch (tgt->GetPolicyStatusCMP0081()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0081) << "\n";
              messageType = MessageType::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
              break;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }
          e << "Found relative path while evaluating link directories of "
               "\""
            << tgt->GetName() << "\":\n  \"" << entryDirectory << "\"\n";
        }
        if (!noMessage) {
          tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
          if (messageType == MessageType::FATAL_ERROR) {
            return;
          }
        }
      }

      // Sanitize the path the same way the link_directories command does
      // in case projects set the LINK_DIRECTORIES property directly.
      cmSystemTools::ConvertToUnixSlashes(entryDirectory);
      if (uniqueDirectories.insert(entryDirectory).second) {
        directories.emplace_back(entryDirectory);
        if (debugDirectories) {
          usedDirectories += " * " + entryDirectory + "\n";
        }
      }
    }
    if (!usedDirectories.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used link directories for target ") + tgt->GetName() +
          ":\n" + usedDirectories,
        entry->GetBacktrace());
    }
  }
}